

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract
               (data_view *data,DataType baseType,vector<double,_std::allocator<double>_> *val)

{
  string_view val_00;
  bool bVar1;
  uint uVar2;
  reference this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 in_ESI;
  double dVar3;
  complex<double> *cval_1;
  iterator __end3;
  iterator __begin3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  NamedPoint npval;
  Time time;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  data_view *in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  size_t in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffe88;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [8];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  defV *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffff58;
  double local_50;
  
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
  switch(in_ESI) {
  case 0:
  case 9:
  default:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
              ((data_view *)in_stack_fffffffffffffe50);
    helicsGetVector(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    break;
  case 1:
    ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe50);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
               (value_type_conflict3 *)in_stack_fffffffffffffe48);
    break;
  case 2:
    ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe50);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
               (value_type_conflict3 *)in_stack_fffffffffffffe48);
    break;
  case 3:
    ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe50);
    std::complex<double>::real_abi_cxx11_((complex<double> *)&stack0xffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
               (value_type_conflict3 *)in_stack_fffffffffffffe48);
    dVar3 = std::complex<double>::imag_abi_cxx11_((complex<double> *)&stack0xffffffffffffff48);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      std::complex<double>::imag_abi_cxx11_((complex<double> *)&stack0xffffffffffffff48);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
                 (value_type_conflict3 *)in_stack_fffffffffffffe48);
    }
    break;
  case 4:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((data_view *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    break;
  case 5:
    this_00 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_e0;
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret(in_stack_fffffffffffffe68);
    this_01 = in_RDX;
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size(this_00);
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)this_01,(size_type)this_00);
    local_e8 = local_e0;
    local_f0._M_current =
         (complex<double> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                   ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                    in_stack_fffffffffffffe48);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe48);
    while (bVar1 = __gnu_cxx::
                   operator==<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                             ((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)in_stack_fffffffffffffe50,
                              (__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                               *)in_stack_fffffffffffffe48), ((bVar1 ^ 0xffU) & 1) != 0) {
      this = __gnu_cxx::
             __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&local_f0);
      dVar3 = std::complex<double>::imag_abi_cxx11_(this);
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        in_stack_fffffffffffffe50 = in_RDX;
        std::abs<double>((complex<double> *)in_RDX);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
                   (value_type_conflict3 *)in_stack_fffffffffffffe48);
      }
      else {
        in_stack_fffffffffffffe60 = in_RDX;
        std::complex<double>::real_abi_cxx11_(this);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
                   (value_type_conflict3 *)in_stack_fffffffffffffe48);
      }
      __gnu_cxx::
      __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
      ::operator++(&local_f0);
    }
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe60);
    break;
  case 6:
    ValueConverter<helics::NamedPoint>::interpret(in_stack_fffffffffffffe68);
    uVar2 = std::isnan(local_50);
    if ((uVar2 & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
                 (value_type_conflict3 *)in_stack_fffffffffffffe58);
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe50);
      val_00._M_str = in_stack_fffffffffffffe88;
      val_00._M_len = in_stack_fffffffffffffe80;
      helicsGetVector(val_00);
      CLI::std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      CLI::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    }
    NamedPoint::~NamedPoint((NamedPoint *)0x3a3ae2);
    break;
  case 8:
    ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe50);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe60,
               (int64_t)in_stack_fffffffffffffe58,
               (time_units)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    TimeRepresentation::operator_cast_to_double
              ((TimeRepresentation<count_time<9,_long>_> *)0x3a399f);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe50,
               (value_type_conflict3 *)in_stack_fffffffffffffe48);
    break;
  case 0x1e:
    readJsonValue_abi_cxx11_((data_view *)npval.name._M_dataplus._M_p);
    valueExtract(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    CLI::std::
    variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x3a3d88);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<double>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.push_back(ValueConverter<double>::interpret(data));
            break;
        }
        case DataType::HELICS_INT: {
            val.push_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)));
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.push_back(static_cast<double>(time));
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetVector(npval.name);
            } else {
                val.push_back(npval.value);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            ValueConverter<std::vector<double>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val.reserve(cvec.size());
            for (auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}